

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::ReporterRegistry::ReporterRegistry(ReporterRegistry *this)

{
  ReporterRegistryImpl *pRVar1;
  IReporterFactory *pIVar2;
  mapped_type *pmVar3;
  allocator<char> local_41;
  IReporterFactory *local_40;
  key_type local_38;
  
  Detail::make_unique<Catch::ReporterRegistry::ReporterRegistryImpl>();
  Detail::make_unique<Catch::ReporterFactory<Catch::AutomakeReporter>>();
  pRVar1 = (this->m_impl).m_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Automake",&local_41);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
           ::operator[](&pRVar1->factories,&local_38);
  pIVar2 = local_40;
  local_40 = (IReporterFactory *)0x0;
  if (pmVar3->m_ptr != (IReporterFactory *)0x0) {
    (*pmVar3->m_ptr->_vptr_IReporterFactory[1])();
  }
  pmVar3->m_ptr = pIVar2;
  std::__cxx11::string::~string((string *)&local_38);
  if (local_40 != (IReporterFactory *)0x0) {
    (*local_40->_vptr_IReporterFactory[1])();
  }
  Detail::make_unique<Catch::ReporterFactory<Catch::CompactReporter>>();
  pRVar1 = (this->m_impl).m_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"compact",&local_41);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
           ::operator[](&pRVar1->factories,&local_38);
  pIVar2 = local_40;
  local_40 = (IReporterFactory *)0x0;
  if (pmVar3->m_ptr != (IReporterFactory *)0x0) {
    (*pmVar3->m_ptr->_vptr_IReporterFactory[1])();
  }
  pmVar3->m_ptr = pIVar2;
  std::__cxx11::string::~string((string *)&local_38);
  if (local_40 != (IReporterFactory *)0x0) {
    (*local_40->_vptr_IReporterFactory[1])();
  }
  Detail::make_unique<Catch::ReporterFactory<Catch::ConsoleReporter>>();
  pRVar1 = (this->m_impl).m_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"console",&local_41);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
           ::operator[](&pRVar1->factories,&local_38);
  pIVar2 = local_40;
  local_40 = (IReporterFactory *)0x0;
  if (pmVar3->m_ptr != (IReporterFactory *)0x0) {
    (*pmVar3->m_ptr->_vptr_IReporterFactory[1])();
  }
  pmVar3->m_ptr = pIVar2;
  std::__cxx11::string::~string((string *)&local_38);
  if (local_40 != (IReporterFactory *)0x0) {
    (*local_40->_vptr_IReporterFactory[1])();
  }
  Detail::make_unique<Catch::ReporterFactory<Catch::JunitReporter>>();
  pRVar1 = (this->m_impl).m_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"JUnit",&local_41);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
           ::operator[](&pRVar1->factories,&local_38);
  pIVar2 = local_40;
  local_40 = (IReporterFactory *)0x0;
  if (pmVar3->m_ptr != (IReporterFactory *)0x0) {
    (*pmVar3->m_ptr->_vptr_IReporterFactory[1])();
  }
  pmVar3->m_ptr = pIVar2;
  std::__cxx11::string::~string((string *)&local_38);
  if (local_40 != (IReporterFactory *)0x0) {
    (*local_40->_vptr_IReporterFactory[1])();
  }
  Detail::make_unique<Catch::ReporterFactory<Catch::SonarQubeReporter>>();
  pRVar1 = (this->m_impl).m_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"SonarQube",&local_41);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
           ::operator[](&pRVar1->factories,&local_38);
  pIVar2 = local_40;
  local_40 = (IReporterFactory *)0x0;
  if (pmVar3->m_ptr != (IReporterFactory *)0x0) {
    (*pmVar3->m_ptr->_vptr_IReporterFactory[1])();
  }
  pmVar3->m_ptr = pIVar2;
  std::__cxx11::string::~string((string *)&local_38);
  if (local_40 != (IReporterFactory *)0x0) {
    (*local_40->_vptr_IReporterFactory[1])();
  }
  Detail::make_unique<Catch::ReporterFactory<Catch::TAPReporter>>();
  pRVar1 = (this->m_impl).m_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"TAP",&local_41);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
           ::operator[](&pRVar1->factories,&local_38);
  pIVar2 = local_40;
  local_40 = (IReporterFactory *)0x0;
  if (pmVar3->m_ptr != (IReporterFactory *)0x0) {
    (*pmVar3->m_ptr->_vptr_IReporterFactory[1])();
  }
  pmVar3->m_ptr = pIVar2;
  std::__cxx11::string::~string((string *)&local_38);
  if (local_40 != (IReporterFactory *)0x0) {
    (*local_40->_vptr_IReporterFactory[1])();
  }
  Detail::make_unique<Catch::ReporterFactory<Catch::TeamCityReporter>>();
  pRVar1 = (this->m_impl).m_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"TeamCity",&local_41);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
           ::operator[](&pRVar1->factories,&local_38);
  pIVar2 = local_40;
  local_40 = (IReporterFactory *)0x0;
  if (pmVar3->m_ptr != (IReporterFactory *)0x0) {
    (*pmVar3->m_ptr->_vptr_IReporterFactory[1])();
  }
  pmVar3->m_ptr = pIVar2;
  std::__cxx11::string::~string((string *)&local_38);
  if (local_40 != (IReporterFactory *)0x0) {
    (*local_40->_vptr_IReporterFactory[1])();
  }
  Detail::make_unique<Catch::ReporterFactory<Catch::XmlReporter>>();
  pRVar1 = (this->m_impl).m_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"XML",&local_41);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
           ::operator[](&pRVar1->factories,&local_38);
  pIVar2 = local_40;
  local_40 = (IReporterFactory *)0x0;
  if (pmVar3->m_ptr != (IReporterFactory *)0x0) {
    (*pmVar3->m_ptr->_vptr_IReporterFactory[1])();
  }
  pmVar3->m_ptr = pIVar2;
  std::__cxx11::string::~string((string *)&local_38);
  if (local_40 != (IReporterFactory *)0x0) {
    (*local_40->_vptr_IReporterFactory[1])();
  }
  Detail::make_unique<Catch::ReporterFactory<Catch::JsonReporter>>();
  pRVar1 = (this->m_impl).m_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"JSON",&local_41);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
           ::operator[](&pRVar1->factories,&local_38);
  pIVar2 = local_40;
  local_40 = (IReporterFactory *)0x0;
  if (pmVar3->m_ptr != (IReporterFactory *)0x0) {
    (*pmVar3->m_ptr->_vptr_IReporterFactory[1])();
  }
  pmVar3->m_ptr = pIVar2;
  std::__cxx11::string::~string((string *)&local_38);
  if (local_40 != (IReporterFactory *)0x0) {
    (**(code **)(*(long *)local_40 + 8))();
  }
  return;
}

Assistant:

ReporterRegistry::ReporterRegistry():
        m_impl( Detail::make_unique<ReporterRegistryImpl>() ) {
        // Because it is impossible to move out of initializer list,
        // we have to add the elements manually
        m_impl->factories["Automake"] =
            Detail::make_unique<ReporterFactory<AutomakeReporter>>();
        m_impl->factories["compact"] =
            Detail::make_unique<ReporterFactory<CompactReporter>>();
        m_impl->factories["console"] =
            Detail::make_unique<ReporterFactory<ConsoleReporter>>();
        m_impl->factories["JUnit"] =
            Detail::make_unique<ReporterFactory<JunitReporter>>();
        m_impl->factories["SonarQube"] =
            Detail::make_unique<ReporterFactory<SonarQubeReporter>>();
        m_impl->factories["TAP"] =
            Detail::make_unique<ReporterFactory<TAPReporter>>();
        m_impl->factories["TeamCity"] =
            Detail::make_unique<ReporterFactory<TeamCityReporter>>();
        m_impl->factories["XML"] =
            Detail::make_unique<ReporterFactory<XmlReporter>>();
        m_impl->factories["JSON"] =
            Detail::make_unique<ReporterFactory<JsonReporter>>();
    }